

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

char * Wlc_PrsStrtok(char *s,char *delim)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  char *tok;
  int sc;
  int c;
  char *spanp;
  char *delim_local;
  char *s_local;
  
  pcVar4 = s;
  if ((s == (char *)0x0) &&
     (delim_local = Wlc_PrsStrtok::last, pcVar4 = delim_local, Wlc_PrsStrtok::last == (char *)0x0))
  {
    return (char *)0x0;
  }
  do {
    delim_local = pcVar4;
    pcVar3 = delim_local;
    _sc = delim;
    do {
      cVar1 = *_sc;
      if (cVar1 == '\0') {
        if (*delim_local == '\0') {
          Wlc_PrsStrtok::last = (char *)0x0;
          return (char *)0x0;
        }
        do {
          pcVar4 = delim_local + 1;
          cVar1 = *delim_local;
          _sc = delim;
          delim_local = pcVar4;
          if (cVar1 == '\\') {
            cVar1 = '\\';
            while (cVar1 != ' ') {
              cVar1 = *delim_local;
              delim_local = delim_local + 1;
            }
            cVar1 = *delim_local;
            delim_local = delim_local + 1;
          }
          do {
            cVar2 = *_sc;
            if (cVar2 == cVar1) {
              if (cVar1 == '\0') {
                delim_local = (char *)0x0;
              }
              else {
                delim_local[-1] = '\0';
              }
              Wlc_PrsStrtok::last = delim_local;
              return pcVar3;
            }
            _sc = _sc + 1;
          } while (cVar2 != '\0');
        } while( true );
      }
      _sc = _sc + 1;
      pcVar4 = delim_local + 1;
    } while (*delim_local != cVar1);
  } while( true );
}

Assistant:

char * Wlc_PrsStrtok( char * s, const char * delim )
{
  const char *spanp;
  int c, sc;
  char *tok;
  static char *last;
  if (s == NULL && (s = last) == NULL)
      return NULL;
  // skip leading delimiters
cont:
  c = *s++;
  for (spanp = delim; (sc = *spanp++) != 0;) 
      if (c == sc)
          goto cont;
  if (c == 0)    // no non-delimiter characters 
      return (last = NULL);
//  tok = s - 1;
  if ( c != '\\' )
      tok = s - 1;
  else
      tok = s - 1;
  // go back to the first non-delimiter character
  s--;
  // find the token
  for (;;) 
  {
      c = *s++;
      if ( c == '\\' )  // skip blind characters
      {
          while ( c != ' ' )
              c = *s++;
          c = *s++;
      }
      spanp = delim;
      do {
          if ((sc = *spanp++) == c) 
          {
              if (c == 0)
                  s = NULL;
              else
                  s[-1] = 0;
              last = s;
              return (tok);
          }
      } while (sc != 0);
  }
  // not reached
  return NULL;
}